

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cc
# Opt level: O2

Expression __thiscall cnn::LSTMBuilder::add_input_impl(LSTMBuilder *this,int prev,Expression *x)

{
  float fVar1;
  byte bVar2;
  undefined8 *puVar3;
  long lVar4;
  LSTMBuilder *pLVar5;
  undefined8 *in_RCX;
  long *plVar6;
  undefined4 in_register_00000034;
  long lVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  double __x;
  double __x_00;
  Expression EVar14;
  Expression i_aot;
  Expression in;
  Expression i_ot;
  Expression ph_t;
  Expression i_ft;
  Expression i_it;
  Expression i_wt;
  undefined1 local_1b0 [8];
  ulong local_1a8;
  Expression local_1a0;
  long local_190;
  uint local_184;
  undefined8 local_180;
  ulong local_178;
  ComputationGraph local_170;
  undefined4 local_138;
  undefined8 local_130;
  undefined4 local_128;
  undefined8 local_120;
  undefined4 local_118;
  ComputationGraph *local_110;
  uint local_108;
  Expression local_100;
  initializer_list<cnn::expr::Expression> local_f0;
  initializer_list<cnn::expr::Expression> local_e0;
  Expression local_d0;
  Expression local_c0;
  LSTMBuilder *local_b0;
  long local_a8;
  Expression local_a0;
  ComputationGraph *local_90;
  uint local_88;
  Expression local_80;
  long *local_70;
  long *local_68;
  long local_60;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_58;
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  *local_50;
  long local_48;
  long local_40;
  ulong local_38;
  ulong uVar7;
  
  lVar8 = CONCAT44(in_register_00000034,prev);
  local_184 = (uint)x;
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_170,
             (ulong)*(uint *)(lVar8 + 0xc0),(allocator_type *)&local_1a0);
  local_50 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar8 + 0x58);
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_50,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      &local_170);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             &local_170);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)&local_170,
             (ulong)*(uint *)(lVar8 + 0xc0),(allocator_type *)&local_1a0);
  local_58 = (vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
              *)(lVar8 + 0x70);
  local_b0 = this;
  std::
  vector<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>,std::allocator<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>>
  ::emplace_back<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            (local_58,(vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                      &local_170);
  std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
            ((_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             &local_170);
  local_a8 = *(long *)(lVar8 + 0x60);
  local_48 = *(long *)(lVar8 + 0x78);
  local_1a0.pg = (ComputationGraph *)*in_RCX;
  local_1a0.i.t = *(uint *)(in_RCX + 1);
  local_68 = (long *)(lVar8 + 0x90);
  local_70 = (long *)(lVar8 + 0xa8);
  lVar12 = 0;
  local_60 = (ulong)local_184 * 0x18;
  lVar11 = 0;
  uVar10 = 0;
  local_40 = lVar8;
  do {
    pLVar5 = local_b0;
    uVar7 = (ulong)*(uint *)(local_40 + 0xc0);
    if (uVar7 <= uVar10) {
      fVar1 = *(float *)(local_40 + 0xc4);
      lVar12 = *(long *)(local_a8 + -0x10);
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        EVar14 = cnn::expr::dropout((expr *)local_b0,(Expression *)(lVar12 + -0x10),fVar1);
        uVar7 = EVar14._8_8_;
      }
      else {
        (local_b0->super_RNNBuilder)._vptr_RNNBuilder = *(_func_int ***)(lVar12 + -0x10);
        (local_b0->super_RNNBuilder).cur.t = *(int *)(lVar12 + -8);
      }
      EVar14._8_8_ = uVar7;
      EVar14.pg = (ComputationGraph *)pLVar5;
      return EVar14;
    }
    bVar13 = (int)local_184 < 0;
    local_190 = *(long *)(local_40 + 0x40);
    local_c0.pg = (ComputationGraph *)0x0;
    local_c0.i.t = 0;
    bVar2 = *(byte *)(local_40 + 0x88);
    if ((int)local_184 < 0) {
      plVar6 = local_70;
      plVar9 = local_68;
      if ((bVar2 & 1) != 0) goto LAB_002614c0;
      local_178 = 0;
      local_180 = 0;
    }
    else {
      plVar6 = (long *)(*(long *)local_58 + local_60);
      plVar9 = (long *)(*(long *)local_50 + local_60);
LAB_002614c0:
      local_180 = *(undefined8 *)(*plVar9 + lVar11);
      local_178 = (ulong)*(uint *)(*plVar9 + 8 + lVar11);
      local_c0.pg = *(ComputationGraph **)(*plVar6 + lVar11);
      local_c0.i.t = *(uint *)(*plVar6 + 8 + lVar11);
    }
    fVar1 = *(float *)(local_40 + 0xc4);
    local_38 = uVar10;
    if ((fVar1 != 0.0) || (NAN(fVar1))) {
      cnn::expr::dropout((expr *)&local_170,&local_1a0,fVar1);
      local_1a0.pg = (ComputationGraph *)
                     local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      local_1a0.i.t =
           (uint)local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    }
    local_80.pg = (ComputationGraph *)0x0;
    local_80.i.t = 0;
    if (bVar13 && (bVar2 & 1) == 0) {
      puVar3 = *(undefined8 **)(local_190 + lVar12);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar3[6];
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar3 + 7);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar3 + 1);
      local_e0._M_len = 3;
    }
    else {
      puVar3 = *(undefined8 **)(local_190 + lVar12);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)puVar3[6];
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(uint *)(puVar3 + 7);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)*puVar3;
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(puVar3 + 1);
      local_170.ee = (ExecutionEngine *)puVar3[2];
      local_138 = *(undefined4 *)(puVar3 + 3);
      local_130 = local_180;
      local_128 = (undefined4)local_178;
      local_120 = puVar3[4];
      local_118 = *(undefined4 *)(puVar3 + 5);
      local_110 = local_c0.pg;
      local_108 = local_c0.i.t;
      local_e0._M_len = 7;
    }
    local_170.parameter_nodes.
    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1a0.pg;
    local_170.parameter_nodes.
    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = local_1a0.i.t;
    local_e0._M_array = (iterator)&local_170;
    cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&local_d0,&local_e0);
    local_80.pg = local_d0.pg;
    local_80.i.t = local_d0.i.t;
    cnn::expr::logistic((expr *)&local_d0,&local_80);
    cnn::expr::operator-((expr *)&local_e0,1.0,&local_d0);
    lVar8 = local_48;
    local_90 = (ComputationGraph *)0x0;
    local_88 = 0;
    if (bVar13 && (bVar2 & 1) == 0) {
      lVar4 = *(long *)(local_190 + lVar12);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(lVar4 + 0xa0);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar4 + 0xa8);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar4 + 0x80);
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar4 + 0x88);
      local_1a8 = 3;
    }
    else {
      lVar4 = *(long *)(local_190 + lVar12);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(lVar4 + 0xa0);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)(lVar4 + 0xa8);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar4 + 0x80);
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar4 + 0x88);
      local_170.ee = *(ExecutionEngine **)(lVar4 + 0x90);
      local_138 = *(undefined4 *)(lVar4 + 0x98);
      local_130 = local_180;
      local_128 = (undefined4)local_178;
      local_1a8 = 5;
    }
    local_170.parameter_nodes.
    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = local_1a0.i.t;
    local_170.parameter_nodes.
    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_1a0.pg;
    local_1b0 = (undefined1  [8])&local_170;
    cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
              ((detail *)&local_a0,(initializer_list<cnn::expr::Expression> *)local_1b0);
    local_90 = local_a0.pg;
    local_88 = local_a0.i.t;
    cnn::expr::tanh((expr *)&local_a0,__x);
    if (bVar13 && (bVar2 & 1) == 0) {
      cnn::expr::cwise_multiply((expr *)&local_170,&local_d0,&local_a0);
      lVar8 = *(long *)(lVar8 + -0x18);
      *(pointer *)(lVar8 + lVar11) =
           local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      *(uint *)(lVar8 + 8 + lVar11) =
           (uint)local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      local_1b0 = (undefined1  [8])0x0;
      local_1a8 = local_1a8 & 0xffffffff00000000;
      lVar8 = *(long *)(local_190 + lVar12);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(lVar8 + 0x70);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar8 + 0x78);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar8 + 0x40);
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar8 + 0x48);
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1a0.pg;
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1a0.i.t;
      local_f0._M_len = 3;
      local_f0._M_array = (iterator)&local_170;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_100,&local_f0);
      local_1a8 = CONCAT44(local_1a8._4_4_,local_100.i.t);
    }
    else {
      cnn::expr::cwise_multiply((expr *)&local_170,&local_d0,&local_a0);
      cnn::expr::cwise_multiply((expr *)local_1b0,(Expression *)&local_e0,&local_c0);
      cnn::expr::operator+((expr *)&local_100,(Expression *)local_1b0,(Expression *)&local_170);
      lVar8 = *(long *)(lVar8 + -0x18);
      *(ComputationGraph **)(lVar8 + lVar11) = local_100.pg;
      *(uint *)(lVar8 + 8 + lVar11) = local_100.i.t;
      local_1b0 = (undefined1  [8])0x0;
      local_1a8 = local_1a8 & 0xffffffff00000000;
      lVar4 = *(long *)(local_190 + lVar12);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = *(pointer *)(lVar4 + 0x70);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(uint *)(lVar4 + 0x78);
      local_170.nodes.super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)(lVar4 + 0x40);
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = *(undefined4 *)(lVar4 + 0x48);
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_1a0.pg;
      local_170.parameter_nodes.
      super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = local_1a0.i.t;
      local_170.ee = *(ExecutionEngine **)(lVar4 + 0x50);
      local_138 = *(undefined4 *)(lVar4 + 0x58);
      local_130 = local_180;
      local_128 = (undefined4)local_178;
      local_120 = *(undefined8 *)(lVar4 + 0x60);
      local_118 = *(undefined4 *)(lVar4 + 0x68);
      local_110 = *(ComputationGraph **)(lVar8 + lVar11);
      local_108 = *(uint *)(lVar8 + 8 + lVar11);
      local_f0._M_len = 7;
      local_f0._M_array = (iterator)&local_170;
      cnn::expr::detail::f<cnn::AffineTransform,std::initializer_list<cnn::expr::Expression>>
                ((detail *)&local_100,&local_f0);
      local_1a8 = CONCAT44(local_1a8._4_4_,local_100.i.t);
    }
    cnn::expr::logistic((expr *)&local_170,(Expression *)local_1b0);
    cnn::expr::tanh((expr *)&local_100,__x_00);
    cnn::expr::cwise_multiply((expr *)&local_f0,(Expression *)&local_170,&local_100);
    lVar8 = *(long *)(local_a8 + -0x18);
    *(iterator *)(lVar8 + lVar11) = local_f0._M_array;
    *(uint *)(lVar8 + 8 + lVar11) = (uint)local_f0._M_len;
    local_1a0.pg = (ComputationGraph *)local_f0._M_array;
    local_1a0.i.t = (uint)local_f0._M_len;
    uVar10 = local_38 + 1;
    lVar11 = lVar11 + 0x10;
    lVar12 = lVar12 + 0x18;
  } while( true );
}

Assistant:

Expression LSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // apply dropout according to http://arxiv.org/pdf/1409.2329v5.pdf
    if (dropout_rate) in = dropout(in, dropout_rate);
    // input
    Expression i_ait;
    if (has_prev_state)
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1, vars[C2I], i_c_tm1});
    else
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state)
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1, vars[C2O], ct[i]});
    else
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
  }
  if (dropout_rate) return dropout(ht.back(), dropout_rate);
    else return ht.back();
}